

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

bool __thiscall
qpdf::Stream::filterable
          (Stream *this,
          vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
          *filters,bool *specialized_compression,bool *lossy_compression)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  QPDFObjectHandle *key;
  size_type sVar6;
  mapped_type *pmVar7;
  _Atomic_word *key_00;
  ulong uVar8;
  size_type sVar9;
  size_type sVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  reference pvVar12;
  reference pvVar13;
  element_type *peVar14;
  QPDFObjectHandle local_240;
  undefined1 local_230 [8];
  value_type decode_item;
  value_type filter;
  size_t i_3;
  string local_200;
  uint local_1dc;
  undefined1 local_1d8 [4];
  uint i_2;
  int local_1c4;
  undefined1 local_1c0 [4];
  int i_1;
  undefined1 local_1b0 [8];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> decode_parms;
  string local_190 [32];
  undefined1 local_170 [8];
  QPDFObjectHandle decode_obj;
  _Self local_150;
  _Self local_148;
  iterator ff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filter_name;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool filterable;
  string local_110;
  string local_f0;
  undefined1 local_d0 [8];
  QPDFObjectHandle item;
  int i;
  int n;
  undefined1 local_98 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filter_names;
  bool filters_okay;
  allocator<char> local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  QPDFObjectHandle filter_obj;
  Members *s;
  bool *lossy_compression_local;
  bool *specialized_compression_local;
  vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
  *filters_local;
  Stream *this_local;
  
  filter_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)stream(this);
  key = &((Members *)
         filter_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->stream_dict;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"/Filter",&local_69);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_48,(string *)key);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  filter_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_98);
  bVar1 = QPDFObjectHandle::isNull((QPDFObjectHandle *)local_48);
  if (!bVar1) {
    bVar1 = QPDFObjectHandle::isName((QPDFObjectHandle *)local_48);
    if (bVar1) {
      QPDFObjectHandle::getName_abi_cxx11_((string *)&i,(QPDFObjectHandle *)local_48);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_98,(value_type *)&i);
      std::__cxx11::string::~string((string *)&i);
    }
    else {
      bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_48);
      if (bVar1) {
        item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_48);
        for (item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._0_4_ = 0;
            (int)item.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
            item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_;
            item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._0_4_ =
                 (int)item.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
                 1) {
          QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_d0,(int)local_48);
          bVar1 = QPDFObjectHandle::isName((QPDFObjectHandle *)local_d0);
          if (bVar1) {
            QPDFObjectHandle::getName_abi_cxx11_(&local_f0,(QPDFObjectHandle *)local_d0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_98,&local_f0);
            std::__cxx11::string::~string((string *)&local_f0);
          }
          else {
            filter_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
          }
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d0);
        }
      }
      else {
        filter_names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
      }
    }
  }
  if ((filter_names.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
    QTC::TC("qpdf","QPDF_Stream invalid filter",0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"stream filter type is not name or array",
               (allocator<char> *)&filterable);
    warn(this,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)&filterable);
    bVar1 = false;
  }
  else {
    bVar1 = true;
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_98);
    filter_name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_98);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&filter_name), bVar2) {
      ff._M_node = (_Base_ptr)
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end1);
      sVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::count(&filter_abbreviations_abi_cxx11_,(key_type *)ff._M_node);
      if (sVar6 != 0) {
        QTC::TC("qpdf","QPDF_Stream expand filter abbreviation",0);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&filter_abbreviations_abi_cxx11_,(key_type *)ff._M_node);
        std::__cxx11::string::operator=((string *)ff._M_node,(string *)pmVar7);
      }
      local_148._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFStreamFilter>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFStreamFilter>_()>_>_>_>
           ::find(&filter_factories_abi_cxx11_,ff._M_node);
      local_150._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFStreamFilter>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFStreamFilter>_()>_>_>_>
           ::end(&filter_factories_abi_cxx11_);
      bVar2 = std::operator==(&local_148,&local_150);
      if (bVar2) {
        bVar1 = false;
      }
      else {
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFStreamFilter>_()>_>_>
        ::operator->(&local_148);
        std::function<std::shared_ptr<QPDFStreamFilter>_()>::operator()
                  ((function<std::shared_ptr<QPDFStreamFilter>_()> *)
                   &decode_obj.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::
        vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
        ::push_back(filters,(value_type *)
                            &decode_obj.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
        ;
        std::shared_ptr<QPDFStreamFilter>::~shared_ptr
                  ((shared_ptr<QPDFStreamFilter> *)
                   &decode_obj.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    if (bVar1) {
      key_00 = &(filter_obj.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _M_use_count;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_190,"/DecodeParms",
                 (allocator<char> *)
                 ((long)&decode_parms.
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_170,(string *)key_00);
      std::__cxx11::string::~string(local_190);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&decode_parms.
                         super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_1b0);
      bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_170);
      if ((bVar2) &&
         (iVar3 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_170), iVar3 == 0)) {
        QPDFObjectHandle::newNull();
        QPDFObjectHandle::operator=((QPDFObjectHandle *)local_170,(QPDFObjectHandle *)local_1c0);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1c0);
      }
      bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_170);
      if (bVar2) {
        for (local_1c4 = 0; iVar3 = local_1c4,
            iVar4 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_170), iVar3 < iVar4;
            local_1c4 = local_1c4 + 1) {
          QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_1d8,(int)local_170);
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_1b0,
                     (value_type *)local_1d8);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1d8);
        }
      }
      else {
        for (local_1dc = 0; uVar8 = (ulong)local_1dc,
            sVar9 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_98), uVar8 < sVar9; local_1dc = local_1dc + 1) {
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                    ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_1b0,
                     (value_type *)local_170);
        }
      }
      sVar9 = std::
              vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
              ::size(filters);
      if (sVar9 != 0) {
        sVar9 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::size
                          ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_1b0)
        ;
        sVar10 = std::
                 vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                 ::size(filters);
        if (sVar9 != sVar10) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_200,"stream /DecodeParms length is inconsistent with filters",
                     (allocator<char> *)((long)&i_3 + 7));
          warn(this,&local_200);
          std::__cxx11::string::~string((string *)&local_200);
          std::allocator<char>::~allocator((allocator<char> *)((long)&i_3 + 7));
          bVar1 = false;
        }
      }
      if (bVar1) {
        for (filter.super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var11 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      std::
                      vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                      ::size(filters),
            filter.super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi < p_Var11;
            filter.super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&(filter.super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1)) {
          pvVar12 = std::
                    vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                    ::at(filters,(size_type)
                                 filter.
                                 super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
          std::shared_ptr<QPDFStreamFilter>::shared_ptr
                    ((shared_ptr<QPDFStreamFilter> *)
                     &decode_item.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pvVar12
                    );
          pvVar13 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)
                               local_1b0,
                               (size_type)
                               filter.
                               super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
          QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_230,pvVar13);
          peVar14 = std::
                    __shared_ptr_access<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&decode_item.super_BaseHandle.obj.
                                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount);
          QPDFObjectHandle::QPDFObjectHandle(&local_240,(QPDFObjectHandle *)local_230);
          uVar5 = (*peVar14->_vptr_QPDFStreamFilter[2])(peVar14,&local_240);
          QPDFObjectHandle::~QPDFObjectHandle(&local_240);
          if ((uVar5 & 1) == 0) {
            bVar1 = false;
          }
          else {
            peVar14 = std::
                      __shared_ptr_access<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&decode_item.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount);
            uVar5 = (*peVar14->_vptr_QPDFStreamFilter[4])();
            if ((uVar5 & 1) != 0) {
              *specialized_compression = true;
            }
            peVar14 = std::
                      __shared_ptr_access<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&decode_item.super_BaseHandle.obj.
                                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount);
            uVar5 = (*peVar14->_vptr_QPDFStreamFilter[5])();
            if ((uVar5 & 1) != 0) {
              *specialized_compression = true;
              *lossy_compression = true;
            }
          }
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_230);
          std::shared_ptr<QPDFStreamFilter>::~shared_ptr
                    ((shared_ptr<QPDFStreamFilter> *)
                     &decode_item.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
      }
      else {
        bVar1 = false;
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_1b0);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_170);
    }
    else {
      bVar1 = false;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_98);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
  return bVar1;
}

Assistant:

bool
Stream::filterable(
    std::vector<std::shared_ptr<QPDFStreamFilter>>& filters,
    bool& specialized_compression,
    bool& lossy_compression)
{
    auto s = stream();
    // Check filters

    QPDFObjectHandle filter_obj = s->stream_dict.getKey("/Filter");
    bool filters_okay = true;

    std::vector<std::string> filter_names;

    if (filter_obj.isNull()) {
        // No filters
    } else if (filter_obj.isName()) {
        // One filter
        filter_names.push_back(filter_obj.getName());
    } else if (filter_obj.isArray()) {
        // Potentially multiple filters
        int n = filter_obj.getArrayNItems();
        for (int i = 0; i < n; ++i) {
            QPDFObjectHandle item = filter_obj.getArrayItem(i);
            if (item.isName()) {
                filter_names.push_back(item.getName());
            } else {
                filters_okay = false;
            }
        }
    } else {
        filters_okay = false;
    }

    if (!filters_okay) {
        QTC::TC("qpdf", "QPDF_Stream invalid filter");
        warn("stream filter type is not name or array");
        return false;
    }

    bool filterable = true;

    for (auto& filter_name: filter_names) {
        if (filter_abbreviations.count(filter_name)) {
            QTC::TC("qpdf", "QPDF_Stream expand filter abbreviation");
            filter_name = filter_abbreviations[filter_name];
        }

        auto ff = filter_factories.find(filter_name);
        if (ff == filter_factories.end()) {
            filterable = false;
        } else {
            filters.push_back((ff->second)());
        }
    }

    if (!filterable) {
        return false;
    }

    // filters now contains a list of filters to be applied in order. See which ones we can support.

    // See if we can support any decode parameters that are specified.

    QPDFObjectHandle decode_obj = s->stream_dict.getKey("/DecodeParms");
    std::vector<QPDFObjectHandle> decode_parms;
    if (decode_obj.isArray() && (decode_obj.getArrayNItems() == 0)) {
        decode_obj = QPDFObjectHandle::newNull();
    }
    if (decode_obj.isArray()) {
        for (int i = 0; i < decode_obj.getArrayNItems(); ++i) {
            decode_parms.push_back(decode_obj.getArrayItem(i));
        }
    } else {
        for (unsigned int i = 0; i < filter_names.size(); ++i) {
            decode_parms.push_back(decode_obj);
        }
    }

    // Ignore /DecodeParms entirely if /Filters is empty.  At least one case of a file whose
    // /DecodeParms was [ << >> ] when /Filters was empty has been seen in the wild.
    if ((filters.size() != 0) && (decode_parms.size() != filters.size())) {
        warn("stream /DecodeParms length is inconsistent with filters");
        filterable = false;
    }

    if (!filterable) {
        return false;
    }

    for (size_t i = 0; i < filters.size(); ++i) {
        auto filter = filters.at(i);
        auto decode_item = decode_parms.at(i);

        if (filter->setDecodeParms(decode_item)) {
            if (filter->isSpecializedCompression()) {
                specialized_compression = true;
            }
            if (filter->isLossyCompression()) {
                specialized_compression = true;
                lossy_compression = true;
            }
        } else {
            filterable = false;
        }
    }

    return filterable;
}